

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void br_aes_ct64_bitslice_Sbox(uint64_t *q)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong *in_RDI;
  uint64_t t59;
  uint64_t t58;
  uint64_t t57;
  uint64_t t56;
  uint64_t t55;
  uint64_t t54;
  uint64_t t53;
  uint64_t t52;
  uint64_t t51;
  uint64_t t50;
  uint64_t t49;
  uint64_t t48;
  uint64_t t47;
  uint64_t t46;
  uint64_t t45;
  uint64_t t44;
  uint64_t t43;
  uint64_t t42;
  uint64_t t41;
  uint64_t t40;
  uint64_t t39;
  uint64_t t38;
  uint64_t t37;
  uint64_t t36;
  uint64_t t35;
  uint64_t t34;
  uint64_t t33;
  uint64_t t32;
  uint64_t t31;
  uint64_t t30;
  uint64_t t29;
  uint64_t t28;
  uint64_t t27;
  uint64_t t26;
  uint64_t t25;
  uint64_t t24;
  uint64_t t23;
  uint64_t t22;
  uint64_t t21;
  uint64_t t20;
  uint64_t t19;
  uint64_t t18;
  uint64_t t17;
  uint64_t t16;
  uint64_t t15;
  uint64_t t14;
  uint64_t t13;
  uint64_t t12;
  uint64_t t11;
  uint64_t t10;
  uint64_t t9;
  uint64_t t8;
  uint64_t t7;
  uint64_t t6;
  uint64_t t5;
  uint64_t t4;
  uint64_t t3;
  uint64_t t2;
  uint64_t t1;
  uint64_t t0;
  uint64_t z17;
  uint64_t z16;
  uint64_t z15;
  uint64_t z14;
  uint64_t z13;
  uint64_t z12;
  uint64_t z11;
  uint64_t z10;
  uint64_t z9;
  uint64_t z8;
  uint64_t z7;
  uint64_t z6;
  uint64_t z5;
  uint64_t z4;
  uint64_t z3;
  uint64_t z2;
  uint64_t z1;
  uint64_t z0;
  uint64_t y21;
  uint64_t y20;
  uint64_t y19;
  uint64_t y18;
  uint64_t y17;
  uint64_t y16;
  uint64_t y15;
  uint64_t y14;
  uint64_t y13;
  uint64_t y12;
  uint64_t y11;
  uint64_t y10;
  uint64_t y9;
  uint64_t y8;
  uint64_t y7;
  uint64_t y6;
  uint64_t y5;
  uint64_t y4;
  uint64_t y3;
  uint64_t y2;
  uint64_t y1;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t x0;
  uint64_t s7;
  uint64_t s6;
  uint64_t s5;
  uint64_t s4;
  uint64_t s3;
  uint64_t s2;
  uint64_t s1;
  uint64_t s0;
  uint64_t t67;
  uint64_t t66;
  uint64_t t65;
  uint64_t t64;
  uint64_t t63;
  uint64_t t62;
  uint64_t t61;
  uint64_t t60;
  
  uVar26 = in_RDI[7];
  uVar1 = in_RDI[4];
  uVar11 = in_RDI[2];
  uVar2 = *in_RDI;
  uVar3 = uVar1 ^ uVar11;
  uVar4 = uVar26 ^ in_RDI[1];
  uVar5 = uVar26 ^ uVar1;
  uVar6 = uVar26 ^ uVar11;
  uVar7 = in_RDI[6] ^ in_RDI[5];
  uVar8 = uVar7 ^ uVar2;
  uVar9 = uVar4 ^ uVar3;
  uVar10 = uVar8 ^ in_RDI[1];
  uVar11 = in_RDI[3] ^ uVar9 ^ uVar11;
  uVar12 = in_RDI[3] ^ uVar9 ^ in_RDI[6];
  uVar13 = uVar11 ^ uVar7;
  uVar14 = uVar12 ^ uVar5;
  uVar7 = uVar7 ^ uVar14;
  uVar15 = uVar3 & (uVar13 ^ uVar14) ^ uVar5 & uVar14;
  uVar16 = uVar6 & uVar13 ^ uVar5 & uVar14;
  uVar12 = (uVar10 ^ uVar6) & (uVar11 ^ uVar2) ^ uVar9 & uVar11 ^ uVar15 ^ uVar12;
  uVar17 = (uVar8 ^ uVar1) & uVar2 ^ uVar9 & uVar11 ^ uVar16 ^ uVar13 ^ uVar6;
  uVar15 = uVar10 & uVar8 ^ uVar4 & uVar7 ^ uVar15 ^ uVar4 ^ uVar7;
  uVar18 = (uVar8 ^ uVar26) & (uVar2 ^ uVar14) ^ uVar4 & uVar7 ^ uVar16 ^ uVar26 ^ uVar7;
  uVar19 = uVar12 ^ uVar17;
  uVar12 = uVar12 & uVar15;
  uVar16 = uVar18 ^ uVar12;
  uVar20 = uVar19 & uVar16 ^ uVar17;
  uVar17 = (uVar17 ^ uVar12) & (uVar15 ^ uVar18) ^ uVar18;
  uVar18 = uVar18 & (uVar16 ^ uVar17);
  uVar15 = uVar18 ^ uVar15 ^ uVar17;
  uVar19 = uVar19 ^ uVar20 & (uVar16 ^ uVar18);
  uVar16 = uVar19 ^ uVar15;
  uVar12 = uVar20 ^ uVar17;
  uVar7 = (uVar20 ^ uVar19) & uVar7;
  uVar18 = uVar20 & (uVar2 ^ uVar14);
  uVar21 = (uVar12 ^ uVar16) & (uVar13 ^ uVar14);
  uVar22 = uVar15 & (uVar10 ^ uVar6);
  uVar4 = (uVar20 ^ uVar19) & uVar4;
  uVar3 = (uVar12 ^ uVar16) & uVar3;
  uVar5 = uVar12 & uVar5 ^ uVar3;
  uVar10 = uVar18 ^ uVar19 & uVar10;
  uVar23 = (uVar17 ^ uVar15) & uVar11 ^ uVar7;
  uVar24 = uVar17 & uVar2 ^ uVar4 ^ uVar23;
  uVar25 = uVar19 & uVar8 ^ uVar5;
  uVar7 = uVar7 ^ uVar12 & uVar14 ^ uVar21;
  uVar13 = uVar21 ^ uVar16 & uVar13 ^ uVar25;
  uVar25 = (uVar17 ^ uVar15) & uVar9 ^ uVar22 ^ uVar25;
  uVar9 = uVar19 & uVar8 ^ uVar7;
  uVar26 = uVar20 & (uVar8 ^ uVar26) ^ uVar24 ^ uVar13;
  uVar11 = uVar15 & (uVar11 ^ uVar2) ^ uVar25;
  uVar23 = uVar23 ^ uVar11;
  in_RDI[7] = uVar7 ^ uVar25;
  in_RDI[6] = uVar9 ^ uVar23 ^ 0xffffffffffffffff;
  in_RDI[5] = uVar3 ^ uVar16 & uVar6 ^ uVar9 ^ uVar26 ^ 0xffffffffffffffff;
  in_RDI[4] = uVar23;
  in_RDI[3] = uVar17 & uVar2 ^ uVar18 ^ uVar11;
  in_RDI[2] = uVar22 ^ uVar17 & (uVar8 ^ uVar1) ^ uVar26;
  in_RDI[1] = uVar4 ^ uVar10 ^ uVar13 ^ 0xffffffffffffffff;
  *in_RDI = uVar10 ^ uVar5 ^ uVar24 ^ 0xffffffffffffffff;
  return;
}

Assistant:

static void br_aes_ct64_bitslice_Sbox(uint64_t *q) {
    /*
     * This S-box implementation is a straightforward translation of
     * the circuit described by Boyar and Peralta in "A new
     * combinational logic minimization technique with applications
     * to cryptology" (https://eprint.iacr.org/2009/191.pdf).
     *
     * Note that variables x* (input) and s* (output) are numbered
     * in "reverse" order (x0 is the high bit, x7 is the low bit).
     */

    uint64_t x0, x1, x2, x3, x4, x5, x6, x7;
    uint64_t y1, y2, y3, y4, y5, y6, y7, y8, y9;
    uint64_t y10, y11, y12, y13, y14, y15, y16, y17, y18, y19;
    uint64_t y20, y21;
    uint64_t z0, z1, z2, z3, z4, z5, z6, z7, z8, z9;
    uint64_t z10, z11, z12, z13, z14, z15, z16, z17;
    uint64_t t0, t1, t2, t3, t4, t5, t6, t7, t8, t9;
    uint64_t t10, t11, t12, t13, t14, t15, t16, t17, t18, t19;
    uint64_t t20, t21, t22, t23, t24, t25, t26, t27, t28, t29;
    uint64_t t30, t31, t32, t33, t34, t35, t36, t37, t38, t39;
    uint64_t t40, t41, t42, t43, t44, t45, t46, t47, t48, t49;
    uint64_t t50, t51, t52, t53, t54, t55, t56, t57, t58, t59;
    uint64_t t60, t61, t62, t63, t64, t65, t66, t67;
    uint64_t s0, s1, s2, s3, s4, s5, s6, s7;

    x0 = q[7];
    x1 = q[6];
    x2 = q[5];
    x3 = q[4];
    x4 = q[3];
    x5 = q[2];
    x6 = q[1];
    x7 = q[0];

    /*
     * Top linear transformation.
     */
    y14 = x3 ^ x5;
    y13 = x0 ^ x6;
    y9 = x0 ^ x3;
    y8 = x0 ^ x5;
    t0 = x1 ^ x2;
    y1 = t0 ^ x7;
    y4 = y1 ^ x3;
    y12 = y13 ^ y14;
    y2 = y1 ^ x0;
    y5 = y1 ^ x6;
    y3 = y5 ^ y8;
    t1 = x4 ^ y12;
    y15 = t1 ^ x5;
    y20 = t1 ^ x1;
    y6 = y15 ^ x7;
    y10 = y15 ^ t0;
    y11 = y20 ^ y9;
    y7 = x7 ^ y11;
    y17 = y10 ^ y11;
    y19 = y10 ^ y8;
    y16 = t0 ^ y11;
    y21 = y13 ^ y16;
    y18 = x0 ^ y16;

    /*
     * Non-linear section.
     */
    t2 = y12 & y15;
    t3 = y3 & y6;
    t4 = t3 ^ t2;
    t5 = y4 & x7;
    t6 = t5 ^ t2;
    t7 = y13 & y16;
    t8 = y5 & y1;
    t9 = t8 ^ t7;
    t10 = y2 & y7;
    t11 = t10 ^ t7;
    t12 = y9 & y11;
    t13 = y14 & y17;
    t14 = t13 ^ t12;
    t15 = y8 & y10;
    t16 = t15 ^ t12;
    t17 = t4 ^ t14;
    t18 = t6 ^ t16;
    t19 = t9 ^ t14;
    t20 = t11 ^ t16;
    t21 = t17 ^ y20;
    t22 = t18 ^ y19;
    t23 = t19 ^ y21;
    t24 = t20 ^ y18;

    t25 = t21 ^ t22;
    t26 = t21 & t23;
    t27 = t24 ^ t26;
    t28 = t25 & t27;
    t29 = t28 ^ t22;
    t30 = t23 ^ t24;
    t31 = t22 ^ t26;
    t32 = t31 & t30;
    t33 = t32 ^ t24;
    t34 = t23 ^ t33;
    t35 = t27 ^ t33;
    t36 = t24 & t35;
    t37 = t36 ^ t34;
    t38 = t27 ^ t36;
    t39 = t29 & t38;
    t40 = t25 ^ t39;

    t41 = t40 ^ t37;
    t42 = t29 ^ t33;
    t43 = t29 ^ t40;
    t44 = t33 ^ t37;
    t45 = t42 ^ t41;
    z0 = t44 & y15;
    z1 = t37 & y6;
    z2 = t33 & x7;
    z3 = t43 & y16;
    z4 = t40 & y1;
    z5 = t29 & y7;
    z6 = t42 & y11;
    z7 = t45 & y17;
    z8 = t41 & y10;
    z9 = t44 & y12;
    z10 = t37 & y3;
    z11 = t33 & y4;
    z12 = t43 & y13;
    z13 = t40 & y5;
    z14 = t29 & y2;
    z15 = t42 & y9;
    z16 = t45 & y14;
    z17 = t41 & y8;

    /*
     * Bottom linear transformation.
     */
    t46 = z15 ^ z16;
    t47 = z10 ^ z11;
    t48 = z5 ^ z13;
    t49 = z9 ^ z10;
    t50 = z2 ^ z12;
    t51 = z2 ^ z5;
    t52 = z7 ^ z8;
    t53 = z0 ^ z3;
    t54 = z6 ^ z7;
    t55 = z16 ^ z17;
    t56 = z12 ^ t48;
    t57 = t50 ^ t53;
    t58 = z4 ^ t46;
    t59 = z3 ^ t54;
    t60 = t46 ^ t57;
    t61 = z14 ^ t57;
    t62 = t52 ^ t58;
    t63 = t49 ^ t58;
    t64 = z4 ^ t59;
    t65 = t61 ^ t62;
    t66 = z1 ^ t63;
    s0 = t59 ^ t63;
    s6 = t56 ^ ~t62;
    s7 = t48 ^ ~t60;
    t67 = t64 ^ t65;
    s3 = t53 ^ t66;
    s4 = t51 ^ t66;
    s5 = t47 ^ t65;
    s1 = t64 ^ ~s3;
    s2 = t55 ^ ~t67;

    q[7] = s0;
    q[6] = s1;
    q[5] = s2;
    q[4] = s3;
    q[3] = s4;
    q[2] = s5;
    q[1] = s6;
    q[0] = s7;
}